

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh.cpp
# Opt level: O2

void pbrt::anon_class_1_0_00000001::__invoke(StatsAccumulator *accum)

{
  long in_FS_OFFSET;
  
  StatsAccumulator::ReportMemoryCounter
            (accum,"Memory/Volume grids",*(int64_t *)(in_FS_OFFSET + -0x1e0));
  *(undefined8 *)(in_FS_OFFSET + -0x1e0) = 0;
  return;
}

Assistant:

TriangleMesh::TriangleMesh(const Transform &renderFromObject, bool reverseOrientation,
                           std::vector<int> indices, std::vector<Point3f> p,
                           std::vector<Vector3f> s, std::vector<Normal3f> n,
                           std::vector<Point2f> uv, std::vector<int> faceIndices)
    : nTriangles(indices.size() / 3), nVertices(p.size()) {
    CHECK_EQ((indices.size() % 3), 0);
    ++nTriMeshes;
    nTris += nTriangles;
    triangleBytes += sizeof(*this);
    // Initialize mesh _vertexIndices_
    vertexIndices = intBufferCache->LookupOrAdd(indices);

    // Transform mesh vertices to render space and initialize mesh _p_
    for (Point3f &pt : p)
        pt = renderFromObject(pt);
    this->p = point3BufferCache->LookupOrAdd(p);

    // Remainder of _TriangleMesh_ constructor
    this->reverseOrientation = reverseOrientation;
    this->transformSwapsHandedness = renderFromObject.SwapsHandedness();

    if (!uv.empty()) {
        CHECK_EQ(nVertices, uv.size());
        this->uv = point2BufferCache->LookupOrAdd(uv);
    }
    if (!n.empty()) {
        CHECK_EQ(nVertices, n.size());
        for (Normal3f &nn : n) {
            nn = renderFromObject(nn);
            if (reverseOrientation)
                nn = -nn;
        }
        this->n = normal3BufferCache->LookupOrAdd(n);
    }
    if (!s.empty()) {
        CHECK_EQ(nVertices, s.size());
        for (Vector3f &ss : s)
            ss = renderFromObject(ss);
        this->s = vector3BufferCache->LookupOrAdd(s);
    }

    if (!faceIndices.empty()) {
        CHECK_EQ(nTriangles, faceIndices.size());
        this->faceIndices = intBufferCache->LookupOrAdd(faceIndices);
    }

    // Make sure that we don't have too much stuff to be using integers to
    // index into things.
    CHECK_LE(p.size(), std::numeric_limits<int>::max());
    // We could be clever and check indices.size() / 3 if we were careful
    // to promote to a 64-bit int before multiplying by 3 when we look up
    // in the indices array...
    CHECK_LE(indices.size(), std::numeric_limits<int>::max());
}